

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vkImageUtil.cpp
# Opt level: O0

VkCompareOp vk::mapCompareMode(CompareMode mode)

{
  VkCompareOp local_c;
  CompareMode mode_local;
  
  switch(mode) {
  case COMPAREMODE_NONE:
    local_c = VK_COMPARE_OP_NEVER;
    break;
  case COMPAREMODE_LESS:
    local_c = VK_COMPARE_OP_LESS;
    break;
  case COMPAREMODE_LESS_OR_EQUAL:
    local_c = VK_COMPARE_OP_LESS_OR_EQUAL;
    break;
  case COMPAREMODE_GREATER:
    local_c = VK_COMPARE_OP_GREATER;
    break;
  case COMPAREMODE_GREATER_OR_EQUAL:
    local_c = VK_COMPARE_OP_GREATER_OR_EQUAL;
    break;
  case COMPAREMODE_EQUAL:
    local_c = VK_COMPARE_OP_EQUAL;
    break;
  case COMPAREMODE_NOT_EQUAL:
    local_c = VK_COMPARE_OP_NOT_EQUAL;
    break;
  case COMPAREMODE_ALWAYS:
    local_c = VK_COMPARE_OP_ALWAYS;
    break;
  case COMPAREMODE_NEVER:
    local_c = VK_COMPARE_OP_NEVER;
    break;
  default:
    local_c = VK_COMPARE_OP_NEVER;
  }
  return local_c;
}

Assistant:

vk::VkCompareOp mapCompareMode (tcu::Sampler::CompareMode mode)
{
	switch (mode)
	{
		case tcu::Sampler::COMPAREMODE_NONE:				return vk::VK_COMPARE_OP_NEVER;
		case tcu::Sampler::COMPAREMODE_LESS:				return vk::VK_COMPARE_OP_LESS;
		case tcu::Sampler::COMPAREMODE_LESS_OR_EQUAL:		return vk::VK_COMPARE_OP_LESS_OR_EQUAL;
		case tcu::Sampler::COMPAREMODE_GREATER:				return vk::VK_COMPARE_OP_GREATER;
		case tcu::Sampler::COMPAREMODE_GREATER_OR_EQUAL:	return vk::VK_COMPARE_OP_GREATER_OR_EQUAL;
		case tcu::Sampler::COMPAREMODE_EQUAL:				return vk::VK_COMPARE_OP_EQUAL;
		case tcu::Sampler::COMPAREMODE_NOT_EQUAL:			return vk::VK_COMPARE_OP_NOT_EQUAL;
		case tcu::Sampler::COMPAREMODE_ALWAYS:				return vk::VK_COMPARE_OP_ALWAYS;
		case tcu::Sampler::COMPAREMODE_NEVER:				return vk::VK_COMPARE_OP_NEVER;
		default:
			DE_FATAL("Illegal compare mode");
			return (vk::VkCompareOp)0;
	}
}